

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_writeOptionsDeviations(void *highs,char *filename)

{
  HighsStatus HVar1;
  char *in_RSI;
  bool in_stack_0000015f;
  string *in_stack_00000160;
  Highs *in_stack_00000168;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  HVar1 = Highs::writeOptions(in_stack_00000168,in_stack_00000160,in_stack_0000015f);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return HVar1;
}

Assistant:

HighsInt Highs_writeOptionsDeviations(const void* highs, const char* filename) {
  return (HighsInt)((Highs*)highs)->writeOptions(filename, true);
}